

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O0

FEvent * __thiscall FEventTree::GetNewNode(FEventTree *this)

{
  FEvent *local_18;
  FEvent *node;
  FEventTree *this_local;
  
  if (this->Spare == (FEvent *)0x0) {
    local_18 = (FEvent *)operator_new(0x28);
  }
  else {
    local_18 = this->Spare;
    this->Spare = local_18->Left;
  }
  return local_18;
}

Assistant:

FEvent *FEventTree::GetNewNode ()
{
	FEvent *node;

	if (Spare != NULL)
	{
		node = Spare;
		Spare = node->Left;
	}
	else
	{
		node = new FEvent;
	}
	return node;
}